

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# harvest.cc
# Opt level: O0

void sptk::world::anon_unknown_2::MakeSortedOrder
               (int *boundary_list,int number_of_sections,int *order)

{
  int iVar1;
  int j;
  int i_1;
  int tmp;
  int i;
  int *order_local;
  int number_of_sections_local;
  int *boundary_list_local;
  
  for (i = 0; i < number_of_sections; i = i + 1) {
    order[i] = i;
  }
  for (i_1 = 1; j = i_1, i_1 < number_of_sections; i_1 = i_1 + 1) {
    while ((j = j + -1, -1 < j && (boundary_list[order[i_1] << 1] < boundary_list[order[j] << 1])))
    {
      iVar1 = order[i_1];
      order[i_1] = order[j];
      order[j] = iVar1;
    }
  }
  return;
}

Assistant:

static void MakeSortedOrder(const int *boundary_list, int number_of_sections,
    int *order) {
  for (int i = 0; i < number_of_sections; ++i) order[i] = i;
  int tmp;
  for (int i = 1; i < number_of_sections; ++i)
    for (int j = i - 1; j >= 0; --j)
      if (boundary_list[order[j] * 2] > boundary_list[order[i] * 2]) {
        tmp = order[i];
        order[i] = order[j];
        order[j] = tmp;
      } else {
        break;
      }
}